

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall BoundingBox::intersects(BoundingBox *this)

{
  Image *this_00;
  int local_18 [2];
  
  *(undefined8 *)&(this->min).field_0 = 0;
  *(undefined8 *)((long)&(this->min).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->max).field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->origin).field_0 = 0;
  *(undefined8 *)((long)&(this->origin).field_0 + 8) = 0x3f490fdbbf800000;
  this[1].min.field_0.field_0.y = 0.5890486;
  this_00 = (Image *)operator_new(0x10);
  local_18[0] = 600;
  local_18[1] = 800;
  Image::Image(this_00,local_18 + 1,local_18);
  *(Image **)&this[1].max.field_0 = this_00;
  return;
}

Assistant:

Camera::Camera() {
    position = glm::vec3(0, 0, 0);
    up = glm::vec3(0, 1, 0);
    lookAt = glm::vec3(0, 0, -1);
    fovX = glm::quarter_pi<float>();
    fovY = fovX * 600.0 / 800.0;
    outputImage = new Image(800, 600);
}